

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixedEnvelopes.cpp
# Opt level: O0

void __thiscall
IsoSpec::FixedEnvelope::stochastic_init<true>
          (FixedEnvelope *this,Iso *iso,size_t _no_molecules,double _precision,double _beta_bias)

{
  IsoLayeredGenerator *pIVar1;
  bool bVar2;
  int iVar3;
  long in_RDI;
  undefined1 auVar4 [16];
  IsoStochasticGenerator generator;
  size_t rbin;
  double expected_confs;
  double prob_left_to_1;
  double current_prob;
  double curr_conf_prob_left;
  undefined7 in_stack_fffffffffffffd38;
  char in_stack_fffffffffffffd3f;
  IsoStochasticGenerator *in_stack_fffffffffffffd40;
  IsoStochasticGenerator *in_stack_fffffffffffffd48;
  FixedEnvelope *in_stack_fffffffffffffd50;
  double in_stack_fffffffffffffd58;
  double dVar5;
  undefined5 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd65;
  undefined1 in_stack_fffffffffffffd66;
  undefined1 in_stack_fffffffffffffd67;
  Iso *in_stack_fffffffffffffd68;
  IsoLayeredGenerator *pIVar6;
  IsoStochasticGenerator *in_stack_fffffffffffffd70;
  IsoLayeredGenerator *pIVar7;
  IsoLayeredGenerator *in_stack_fffffffffffffd88;
  IsoLayeredGenerator *in_stack_fffffffffffffd90;
  Iso local_220;
  IsoLayeredGenerator IStack_1d0;
  long local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  long local_e0;
  IsoStochasticGenerator *local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  Iso *local_88;
  char local_79;
  IsoLayeredGenerator *local_78;
  IsoLayeredGenerator *local_70;
  IsoLayeredGenerator *local_68;
  IsoLayeredGenerator *local_60;
  char local_51;
  IsoLayeredGenerator *local_50;
  char local_41;
  IsoLayeredGenerator *local_40;
  char local_31;
  IsoLayeredGenerator *local_30;
  char local_21;
  IsoLayeredGenerator *local_20;
  char local_11;
  IsoLayeredGenerator *local_10;
  char local_1;
  
  IsoStochasticGenerator::IsoStochasticGenerator
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
             CONCAT17(in_stack_fffffffffffffd67,
                      CONCAT16(in_stack_fffffffffffffd66,
                               CONCAT15(in_stack_fffffffffffffd65,in_stack_fffffffffffffd60))),
             in_stack_fffffffffffffd58,(double)in_stack_fffffffffffffd50);
  iVar3 = Iso::getAllDim(&local_220);
  *(int *)(in_RDI + 0x28) = iVar3;
  *(int *)(in_RDI + 0x58) = *(int *)(in_RDI + 0x28) << 2;
  reallocate_memory<true>
            ((FixedEnvelope *)
             CONCAT17(in_stack_fffffffffffffd67,
                      CONCAT16(in_stack_fffffffffffffd66,
                               CONCAT15(in_stack_fffffffffffffd65,in_stack_fffffffffffffd60))),
             (size_t)in_stack_fffffffffffffd58);
  do {
    local_88 = &local_220;
LAB_0013a987:
    do {
      if (local_108 == 0) {
        local_79 = '\0';
        goto LAB_0013b1a7;
      }
      if (local_e8 <= local_f0) {
        local_e0 = 0;
        pIVar6 = &IStack_1d0;
        pIVar7 = pIVar6;
        local_60 = pIVar6;
        pIVar1 = pIVar6;
LAB_0013ad8f:
        do {
          local_30 = pIVar1;
          pIVar6->lProbs_ptr = pIVar6->lProbs_ptr + 1;
          if (pIVar6->lcfmsv <= *pIVar6->lProbs_ptr) {
            local_21 = '\x01';
            pIVar6 = pIVar7;
          }
          else {
            bVar2 = IsoLayeredGenerator::carry(in_stack_fffffffffffffd90);
            pIVar1 = local_30;
            if (bVar2) goto LAB_0013ad8f;
            local_21 = '\0';
            pIVar6 = pIVar7;
          }
          if (local_21 != '\0') {
            local_51 = '\x01';
            goto LAB_0013ae34;
          }
          bVar2 = IsoLayeredGenerator::nextLayer
                            (in_stack_fffffffffffffd90,(double)in_stack_fffffffffffffd88);
          pIVar7 = pIVar6;
          pIVar1 = pIVar6;
        } while (bVar2);
        local_51 = '\0';
LAB_0013ae34:
        if (local_51 == '\0') {
          local_79 = '\0';
          goto LAB_0013b1a7;
        }
        local_78 = &IStack_1d0;
        dVar5 = IStack_1d0.super_IsoGenerator.partialProbs[1];
        local_98 = LayeredMarginal::get_prob
                             (*IStack_1d0.marginalResults,
                              (int)((long)IStack_1d0.lProbs_ptr - (long)IStack_1d0.lProbs_ptr_start
                                   >> 3));
        local_98 = dVar5 * local_98;
        local_f0 = local_98 + local_f0;
        local_90 = local_98;
      }
      else {
        local_e0 = 1;
        local_108 = local_108 + -1;
        local_40 = &IStack_1d0;
        pIVar7 = &IStack_1d0;
LAB_0013aa20:
        do {
          local_10 = pIVar7;
          IStack_1d0.lProbs_ptr = IStack_1d0.lProbs_ptr + 1;
          if (IStack_1d0.lcfmsv <= *IStack_1d0.lProbs_ptr) {
            local_1 = '\x01';
          }
          else {
            bVar2 = IsoLayeredGenerator::carry(in_stack_fffffffffffffd90);
            pIVar7 = local_10;
            if (bVar2) goto LAB_0013aa20;
            local_1 = '\0';
          }
          if (local_1 != '\0') {
            local_31 = '\x01';
            goto LAB_0013aac5;
          }
          bVar2 = IsoLayeredGenerator::nextLayer
                            (in_stack_fffffffffffffd90,(double)in_stack_fffffffffffffd88);
          pIVar7 = &IStack_1d0;
        } while (bVar2);
        local_31 = '\0';
LAB_0013aac5:
        if (local_31 == '\0') {
          local_79 = '\0';
          goto LAB_0013b1a7;
        }
        local_68 = &IStack_1d0;
        dVar5 = IStack_1d0.super_IsoGenerator.partialProbs[1];
        local_98 = LayeredMarginal::get_prob
                             (*IStack_1d0.marginalResults,
                              (int)((long)IStack_1d0.lProbs_ptr - (long)IStack_1d0.lProbs_ptr_start
                                   >> 3));
        local_98 = dVar5 * local_98;
        for (local_f0 = local_98 + local_f0; local_f0 <= local_e8; local_f0 = local_98 + local_f0) {
          in_stack_fffffffffffffd90 = &IStack_1d0;
          pIVar7 = in_stack_fffffffffffffd90;
          local_50 = in_stack_fffffffffffffd90;
          pIVar6 = in_stack_fffffffffffffd90;
LAB_0013abbe:
          do {
            local_20 = pIVar6;
            in_stack_fffffffffffffd90->lProbs_ptr = in_stack_fffffffffffffd90->lProbs_ptr + 1;
            if (in_stack_fffffffffffffd90->lcfmsv <= *in_stack_fffffffffffffd90->lProbs_ptr) {
              local_11 = '\x01';
              in_stack_fffffffffffffd88 = in_stack_fffffffffffffd90;
              in_stack_fffffffffffffd90 = pIVar7;
            }
            else {
              bVar2 = IsoLayeredGenerator::carry(pIVar7);
              pIVar6 = local_20;
              if (bVar2) goto LAB_0013abbe;
              local_11 = '\0';
              in_stack_fffffffffffffd88 = in_stack_fffffffffffffd90;
              in_stack_fffffffffffffd90 = pIVar7;
            }
            if (local_11 != '\0') {
              local_41 = '\x01';
              goto LAB_0013ac63;
            }
            bVar2 = IsoLayeredGenerator::nextLayer
                              (in_stack_fffffffffffffd90,(double)in_stack_fffffffffffffd88);
            pIVar7 = in_stack_fffffffffffffd90;
            pIVar6 = in_stack_fffffffffffffd90;
          } while (bVar2);
          local_41 = '\0';
LAB_0013ac63:
          if (local_41 == '\0') {
            local_79 = '\0';
            goto LAB_0013b1a7;
          }
          local_70 = &IStack_1d0;
          dVar5 = IStack_1d0.super_IsoGenerator.partialProbs[1];
          local_98 = LayeredMarginal::get_prob
                               (*IStack_1d0.marginalResults,
                                (int)((long)IStack_1d0.lProbs_ptr -
                                      (long)IStack_1d0.lProbs_ptr_start >> 3));
          local_98 = dVar5 * local_98;
        }
        if (local_108 == 0) {
          local_79 = '\x01';
          goto LAB_0013b1a7;
        }
        local_90 = local_f0 - local_e8;
      }
      local_a0 = local_100 - local_e8;
      auVar4._8_4_ = (int)((ulong)local_108 >> 0x20);
      auVar4._0_8_ = local_108;
      auVar4._12_4_ = 0x45300000;
      local_a8 = (local_90 *
                 ((auVar4._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_108) - 4503599627370496.0))) / local_a0;
      if (local_a8 <= local_f8) {
        in_stack_fffffffffffffd50 =
             (FixedEnvelope *)
             rdvariate_beta_1_b((double)in_stack_fffffffffffffd40,
                                (mt19937 *)
                                CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
        for (local_e8 = (double)in_stack_fffffffffffffd50 * local_a0 + local_e8;
            local_e8 <= local_f0; local_e8 = (double)in_stack_fffffffffffffd48 * local_a0 + local_e8
            ) {
          local_e0 = local_e0 + 1;
          local_108 = local_108 + -1;
          if (local_108 == 0) {
            local_79 = '\x01';
            goto LAB_0013b1a7;
          }
          local_a0 = local_100 - local_e8;
          in_stack_fffffffffffffd48 =
               (IsoStochasticGenerator *)
               rdvariate_beta_1_b((double)in_stack_fffffffffffffd40,
                                  (mt19937 *)
                                  CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
        }
        if (local_e0 != 0) {
          local_79 = '\x01';
          goto LAB_0013b1a7;
        }
        goto LAB_0013a987;
      }
      in_stack_fffffffffffffd40 =
           (IsoStochasticGenerator *)
           rdvariate_binom((size_t)in_stack_fffffffffffffd48,(double)in_stack_fffffffffffffd40,
                           (mt19937 *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38))
      ;
      local_e0 = (long)&(in_stack_fffffffffffffd40->super_IsoGenerator).super_Iso._vptr_Iso +
                 local_e0;
      local_108 = local_108 - (long)in_stack_fffffffffffffd40;
      local_e8 = local_f0;
      local_b0 = in_stack_fffffffffffffd40;
    } while (local_e0 == 0);
    local_79 = '\x01';
LAB_0013b1a7:
    if (local_79 == '\0') {
      IsoStochasticGenerator::~IsoStochasticGenerator(in_stack_fffffffffffffd40);
      return;
    }
    in_stack_fffffffffffffd3f = local_79;
    addConfILG<true,IsoSpec::IsoStochasticGenerator>
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  } while( true );
}

Assistant:

void FixedEnvelope::stochastic_init(Iso&& iso, size_t _no_molecules, double _precision, double _beta_bias)
{
    IsoStochasticGenerator generator(std::move(iso), _no_molecules, _precision, _beta_bias);

    this->allDim = generator.getAllDim();
    this->allDimSizeofInt = this->allDim * sizeof(int);

    this->reallocate_memory<tgetConfs>(ISOSPEC_INIT_TABLE_SIZE);

    while(generator.advanceToNextConfiguration())
        addConfILG<tgetConfs, IsoStochasticGenerator>(generator);
}